

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

void __thiscall covenant::DFA<covenant::Sym>::eps_close(DFA<covenant::Sym> *this,int state)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  size_type sVar4;
  uint *puVar5;
  reference this_00;
  int in_ESI;
  long in_RDI;
  uint ei_1;
  int es;
  uint ii;
  uint ei;
  SparseSet<0> reach;
  uint in_stack_ffffffffffffff5c;
  SparseSet<0> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  uint local_54;
  uint local_4c;
  uint local_48;
  SparseSet<0> local_38;
  int local_c;
  
  local_c = in_ESI;
  nStates((DFA<covenant::Sym> *)0x22f508);
  SparseSet<0>::SparseSet(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  SparseSet<0>::insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  local_48 = 0;
  while( true ) {
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x30),(long)local_c);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    if (sVar4 <= local_48) break;
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x30),(long)local_c);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_48);
    bVar1 = SparseSet<0>::elem(&local_38,*puVar5);
    if (!bVar1) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x30),(long)local_c);
      std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_48);
      SparseSet<0>::insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    local_48 = local_48 + 1;
  }
  local_4c = 1;
  while( true ) {
    uVar2 = SparseSet<0>::size(&local_38);
    if (uVar2 <= local_4c) break;
    uVar2 = SparseSet<0>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    local_54 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x30),(long)(int)uVar2);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar4 <= local_54) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x30),(long)(int)uVar2);
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_54);
      in_stack_ffffffffffffff77 = SparseSet<0>::elem(&local_38,*puVar5);
      if (!(bool)in_stack_ffffffffffffff77) {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x30),(long)(int)uVar2);
        std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_54);
        SparseSet<0>::insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff60 = (SparseSet<0> *)(in_RDI + 0x30);
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)in_stack_ffffffffffffff60,(long)local_c);
        this_00 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)in_stack_ffffffffffffff60,(long)(int)uVar2);
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(ulong)local_54);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   (value_type_conflict *)pvVar3);
      }
      local_54 = local_54 + 1;
    }
    local_4c = local_4c + 1;
  }
  SparseSet<0>::~SparseSet
            ((SparseSet<0> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void eps_close(int state)
    {
      SparseSet<> reach(nStates());
      reach.insert(state);
      for(unsigned int ei = 0; ei < eps[state].size(); ei++)
      {
        // Added the conditional test after observing some problems
        // running the CFG solver.
        if(!reach.elem(eps[state][ei]))
          reach.insert(eps[state][ei]);
      }

      for(unsigned int ii = 1; ii < reach.size(); ii++)
      {
        int es = reach[ii];
        for(unsigned int ei = 0; ei < eps[es].size(); ei++)
        {
          // Not yet processed
          if(!reach.elem(eps[es][ei]))
          { 
            reach.insert(eps[es][ei]);
            eps[state].push_back(eps[es][ei]);
          }
        }
      }
    }